

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O2

FT_Error T42_Size_Request(FT_Size t42size,FT_Size_Request req)

{
  FT_Face pFVar1;
  long lVar2;
  undefined8 uVar3;
  FT_Fixed FVar4;
  FT_Fixed FVar5;
  FT_Pos FVar6;
  FT_Pos FVar7;
  FT_Error FVar8;
  
  pFVar1 = t42size->face;
  FT_Activate_Size((FT_Size)t42size[1].face);
  FVar8 = FT_Request_Size((FT_Face)pFVar1[3].available_sizes,req);
  if (FVar8 == 0) {
    lVar2 = *(long *)(pFVar1[3].available_sizes + 5);
    (t42size->metrics).max_advance = *(FT_Pos *)(lVar2 + 0x48);
    uVar3 = *(undefined8 *)(lVar2 + 0x18);
    FVar4 = *(FT_Fixed *)(lVar2 + 0x20);
    FVar5 = *(FT_Fixed *)(lVar2 + 0x28);
    FVar6 = *(FT_Pos *)(lVar2 + 0x30);
    FVar7 = *(FT_Pos *)(lVar2 + 0x40);
    (t42size->metrics).descender = *(FT_Pos *)(lVar2 + 0x38);
    (t42size->metrics).height = FVar7;
    (t42size->metrics).y_scale = FVar5;
    (t42size->metrics).ascender = FVar6;
    (t42size->metrics).x_ppem = (short)uVar3;
    (t42size->metrics).y_ppem = (short)((ulong)uVar3 >> 0x10);
    *(int *)&(t42size->metrics).field_0x4 = (int)((ulong)uVar3 >> 0x20);
    (t42size->metrics).x_scale = FVar4;
  }
  return FVar8;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_Size_Request( FT_Size          t42size,      /* T42_Size */
                    FT_Size_Request  req )
  {
    T42_Size  size = (T42_Size)t42size;
    T42_Face  face = (T42_Face)t42size->face;
    FT_Error  error;


    FT_Activate_Size( size->ttsize );

    error = FT_Request_Size( face->ttf_face, req );
    if ( !error )
      t42size->metrics = face->ttf_face->size->metrics;

    return error;
  }